

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

int Curl_debug(Curl_easy *data,curl_infotype type,char *ptr,size_t size,connectdata *conn)

{
  int iVar1;
  size_t size_00;
  char *local_f8;
  char *w;
  char *t;
  char buffer [160];
  int rc;
  connectdata *conn_local;
  size_t size_local;
  char *ptr_local;
  curl_infotype type_local;
  Curl_easy *data_local;
  
  if (((((data->set).printhost & 1U) != 0) && (conn != (connectdata *)0x0)) &&
     ((conn->host).dispname != (char *)0x0)) {
    w = (char *)0x0;
    local_f8 = "Data";
    switch(type) {
    case CURLINFO_HEADER_IN:
      local_f8 = "Header";
    case CURLINFO_DATA_IN:
      w = "from";
      break;
    case CURLINFO_HEADER_OUT:
      local_f8 = "Header";
    case CURLINFO_DATA_OUT:
      w = "to";
    }
    if (w != (char *)0x0) {
      curl_msnprintf((char *)&t,0xa0,"[%s %s %s]",local_f8,w,(conn->host).dispname);
      size_00 = strlen((char *)&t);
      iVar1 = showit(data,CURLINFO_TEXT,(char *)&t,size_00);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
  }
  iVar1 = showit(data,type,ptr,size);
  return iVar1;
}

Assistant:

int Curl_debug(struct Curl_easy *data, curl_infotype type,
               char *ptr, size_t size,
               struct connectdata *conn)
{
  int rc;
  if(data->set.printhost && conn && conn->host.dispname) {
    char buffer[160];
    const char *t=NULL;
    const char *w="Data";
    switch(type) {
    case CURLINFO_HEADER_IN:
      w = "Header";
      /* FALLTHROUGH */
    case CURLINFO_DATA_IN:
      t = "from";
      break;
    case CURLINFO_HEADER_OUT:
      w = "Header";
      /* FALLTHROUGH */
    case CURLINFO_DATA_OUT:
      t = "to";
      break;
    default:
      break;
    }

    if(t) {
      snprintf(buffer, sizeof(buffer), "[%s %s %s]", w, t,
               conn->host.dispname);
      rc = showit(data, CURLINFO_TEXT, buffer, strlen(buffer));
      if(rc)
        return rc;
    }
  }
  rc = showit(data, type, ptr, size);
  return rc;
}